

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CImg.h
# Opt level: O2

CImg<float> * __thiscall cimg_library::CImg<float>::fill(CImg<float> *this,float *val)

{
  float *pfVar1;
  float fVar2;
  bool bVar3;
  float *__s;
  
  bVar3 = is_empty(this);
  if (!bVar3) {
    fVar2 = *val;
    __s = this->_data;
    if ((fVar2 != 0.0) || (NAN(fVar2))) {
      pfVar1 = __s + (ulong)this->_spectrum * (ulong)this->_depth *
                     (ulong)this->_height * (ulong)this->_width;
      for (; __s < pfVar1; __s = __s + 1) {
        *__s = fVar2;
      }
    }
    else {
      memset(__s,0,(ulong)this->_width * (ulong)this->_height *
                   (ulong)this->_spectrum * (ulong)this->_depth * 4);
    }
  }
  return this;
}

Assistant:

CImg<T>& fill(const T& val) {
      if (is_empty()) return *this;
      if (val && sizeof(T)!=1) cimg_for(*this,ptrd,T) *ptrd = val;
      else std::memset(_data,(int)(ulongT)val,sizeof(T)*size()); // Double cast to allow val to be (void*)
      return *this;
    }